

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_2,_3> * tcu::operator*(Matrix<float,_2,_4> *a,Matrix<float,_4,_3> *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  Matrix<float,_2,_3> *in_RDI;
  long lVar4;
  Vector<float,_4> *pVVar5;
  int ndx;
  long lVar6;
  long lVar7;
  float v;
  float fVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  
  *(undefined8 *)(in_RDI->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(in_RDI->m_data).m_data[1].m_data = 0;
  *(undefined8 *)(in_RDI->m_data).m_data[2].m_data = 0;
  auVar2 = _DAT_00ac4b80;
  auVar1 = _DAT_00ac4b30;
  lVar4 = 0;
  bVar10 = true;
  do {
    bVar3 = bVar10;
    lVar6 = 0;
    auVar9 = auVar1;
    do {
      bVar10 = SUB164(auVar9 ^ auVar2,4) == -0x80000000 && SUB164(auVar9 ^ auVar2,0) < -0x7ffffffd;
      if (bVar10) {
        fVar8 = 1.0;
        if (lVar4 != lVar6) {
          fVar8 = 0.0;
        }
        (in_RDI->m_data).m_data[lVar6].m_data[lVar4] = fVar8;
      }
      if (bVar10) {
        fVar8 = 1.0;
        if (lVar4 + -1 != lVar6) {
          fVar8 = 0.0;
        }
        (in_RDI->m_data).m_data[lVar6 + 1].m_data[lVar4] = fVar8;
      }
      lVar6 = lVar6 + 2;
      lVar7 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar7 + 2;
    } while (lVar6 != 4);
    lVar4 = 1;
    bVar10 = false;
  } while (bVar3);
  lVar4 = 0;
  bVar10 = true;
  do {
    bVar3 = bVar10;
    lVar6 = 0;
    pVVar5 = (Vector<float,_4> *)b;
    do {
      fVar8 = 0.0;
      lVar7 = 0;
      do {
        fVar8 = fVar8 + (a->m_data).m_data[lVar7].m_data[lVar4] *
                        ((Vector<tcu::Vector<float,_4>,_3> *)pVVar5->m_data)->m_data[0].m_data
                        [lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      (in_RDI->m_data).m_data[lVar6].m_data[lVar4] = fVar8;
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar6 != 3);
    lVar4 = 1;
    bVar10 = false;
  } while (bVar3);
  return in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}